

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void lab6(Node *ast)

{
  Node NStack_48;
  
  Node::Node(&NStack_48,ast);
  printTree(&NStack_48,0);
  std::vector<Node,_std::allocator<Node>_>::~vector(&NStack_48.subnodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)NStack_48.value._M_dataplus._M_p != &NStack_48.value.field_2) {
    operator_delete(NStack_48.value._M_dataplus._M_p,
                    NStack_48.value.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void lab6(Node &ast) {
    printTree(ast, 0);
}